

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O1

void __thiscall rcg::anon_unknown_1::IOException::IOException(IOException *this,string *_msg)

{
  *(undefined ***)this = &PTR__IOException_00145b38;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->msg);
  return;
}

Assistant:

IOException(const std::string &_msg) { msg=_msg; }